

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Plugin::Fl_Plugin(Fl_Plugin *this,char *klass,char *name)

{
  ID pvVar1;
  undefined1 local_38 [8];
  Fl_Plugin_Manager pm;
  char *name_local;
  char *klass_local;
  Fl_Plugin *this_local;
  
  this->_vptr_Fl_Plugin = (_func_int **)&PTR__Fl_Plugin_002ecfe8;
  this->id = (ID)0x0;
  pm.super_Fl_Preferences.rootNode = (RootNode *)name;
  Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)local_38,klass);
  pvVar1 = Fl_Plugin_Manager::addPlugin
                     ((Fl_Plugin_Manager *)local_38,(char *)pm.super_Fl_Preferences.rootNode,this);
  this->id = pvVar1;
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)local_38);
  return;
}

Assistant:

Fl_Plugin::Fl_Plugin(const char *klass, const char *name)
: id(0) {
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: creating a plugin, class \"%s\", name \"%s\"\n",
         klass, name);
#endif
  Fl_Plugin_Manager pm(klass);
  id = pm.addPlugin(name, this);
}